

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O3

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
* pstore::command_line::details::get_option_and_value
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
             *__return_storage_ptr__,string *arg)

{
  anon_struct_8_0_00000001_for___align aVar1;
  char *pcVar2;
  const_iterator it;
  ulong uVar3;
  long lVar4;
  char cVar5;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  anon_struct_8_0_00000001_for___align local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_88;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_58;
  
  local_88.storage_._8_8_ = 0;
  local_88.storage_._16_8_ = 0;
  local_88._0_8_ = 0;
  local_88.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_88.storage_._24_8_ = 0;
  if (arg->_M_string_length != 0) {
    pcVar2 = (arg->_M_dataplus)._M_p;
    cVar5 = '-';
    lVar4 = 0;
    do {
      if (pcVar2[lVar4] != cVar5) goto LAB_001778eb;
      cVar5 = "--"[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while ((ulong)(arg->_M_string_length != 1) + 1 != lVar4);
    if (cVar5 == '\0') {
      uVar3 = std::__cxx11::string::find((char)arg,0x3d);
      if (uVar3 == 0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)arg,0);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)arg);
        aVar1 = (anon_struct_8_0_00000001_for___align)((long)&local_58.storage_ + 0x10);
        local_58.valid_ = true;
        if (local_a8 == (anon_struct_8_0_00000001_for___align)&local_98) {
          local_58.storage_._24_8_ = uStack_90;
          local_58.storage_.__align = aVar1;
        }
        else {
          local_58.storage_.__align = local_a8;
        }
        local_58.storage_._17_7_ = uStack_97;
        local_58.storage_.__data[0x10] = local_98;
        local_58.storage_._8_8_ = local_a0;
        local_a0 = 0;
        local_98 = 0;
        local_a8 = (anon_struct_8_0_00000001_for___align)&local_98;
        maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        ::operator=(&local_88,&local_58);
        if (local_58.valid_ == true) {
          local_58.valid_ = false;
          if (local_58.storage_.__align != aVar1) {
            operator_delete((void *)local_58.storage_.__align,local_58.storage_._16_8_ + 1);
          }
        }
        if (local_a8 != (anon_struct_8_0_00000001_for___align)&local_98) {
          operator_delete((void *)local_a8,CONCAT71(uStack_97,local_98) + 1);
        }
        if (uVar3 < 2) {
          assert_failed("equal_pos >= double_dash_len",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/command_line.cpp"
                        ,0x69);
        }
        std::__cxx11::string::substr((ulong)&local_58,(ulong)arg);
        std::__cxx11::string::operator=((string *)arg,(string *)&local_58);
        if ((void *)CONCAT71(local_58._1_7_,local_58.valid_) !=
            (void *)((long)&local_58.storage_ + 8)) {
          operator_delete((void *)CONCAT71(local_58._1_7_,local_58.valid_),
                          local_58.storage_._8_8_ + 1);
        }
      }
    }
    else {
LAB_001778eb:
      if (*pcVar2 != '-') goto LAB_00177a7e;
      std::__cxx11::string::erase((ulong)arg,0);
    }
    std::_Tuple_impl<0ul,std::__cxx11::string,pstore::maybe<std::__cxx11::string,void>>::
    _Tuple_impl<std::__cxx11::string&,pstore::maybe<std::__cxx11::string,void>&,void>
              ((_Tuple_impl<0ul,std::__cxx11::string,pstore::maybe<std::__cxx11::string,void>> *)
               __return_storage_ptr__,arg,&local_88);
    if (local_88.valid_ == true) {
      local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
      if (local_88.storage_.__align !=
          (anon_struct_8_0_00000001_for___align)((long)&local_88.storage_ + 0x10)) {
        operator_delete((void *)local_88.storage_.__align,local_88.storage_._16_8_ + 1);
      }
    }
    return __return_storage_ptr__;
  }
LAB_00177a7e:
  assert_failed("starts_with (arg, \"-\")",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/command_line.cpp"
                ,0x6d);
}

Assistant:

maybe<option *> find_handler (std::string const & name) {
                    auto const & all_options = option::all ();
                    auto const end = std::end (all_options);
                    auto const it =
                        std::find_if (std::begin (all_options), end, [&name] (option * const opt) {
                            return opt->name () == name;
                        });
                    return it != end ? just (*it) : nothing<option *> ();
                }